

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall MapWriter_write_Test::TestBody(MapWriter_write_Test *this)

{
  bool *this_00;
  bool bVar1;
  const_iterator __first;
  char *pcVar2;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  uchar *local_168;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  difference_type local_100;
  difference_type num_actual_bytes;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  difference_type local_e8;
  difference_type num_expected_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  unsigned_long local_60 [3];
  undefined1 local_48 [8];
  vector_writer expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_bytes;
  MapWriter_write_Test *this_local;
  
  this_00 = &expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
             flushed_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  pstore::serialize::archive::vector_writer::vector_writer
            ((vector_writer *)local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  local_60[0] = 2;
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,unsigned_long>
            ((vector_writer *)local_48,local_60);
  s_abi_cxx11_(&local_80,"k1",2);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            ((vector_writer *)local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  s_abi_cxx11_(&local_a0,"First key",9);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            ((vector_writer *)local_48,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  s_abi_cxx11_(&local_c0,"k2",2);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            ((vector_writer *)local_48,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &num_expected_bytes,"Second key",10);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            ((vector_writer *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &num_expected_bytes);
  std::__cxx11::string::~string((string *)&num_expected_bytes);
  local_f0._M_current =
       (uchar *)std::begin<pstore::serialize::archive::vector_writer>((vector_writer *)local_48);
  num_actual_bytes =
       (difference_type)
       std::end<pstore::serialize::archive::vector_writer>((vector_writer *)local_48);
  local_e8 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (local_f0,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )num_actual_bytes);
  __first = std::begin<pstore::serialize::archive::vector_writer>(&(this->super_MapWriter).writer_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::end<pstore::serialize::archive::vector_writer>(&(this->super_MapWriter).writer_);
  local_100 = std::
              distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )__first._M_current,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_120,"num_expected_bytes","num_actual_bytes",&local_e8,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_158._M_current =
         (uchar *)std::begin<pstore::serialize::archive::vector_writer>((vector_writer *)local_48);
    local_160._M_current =
         (uchar *)std::end<pstore::serialize::archive::vector_writer>((vector_writer *)local_48);
    local_168 = (uchar *)std::begin<pstore::serialize::archive::vector_writer>
                                   (&(this->super_MapWriter).writer_);
    local_149 = std::
                equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_158,local_160,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_168);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_148,&local_149,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)local_148,
                 (AssertionResult *)
                 "std::equal (std::begin (expected), std::end (expected), std::begin (writer_))",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
                 ,0x134,pcVar2);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  pstore::serialize::archive::vector_writer::~vector_writer((vector_writer *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
              flushed_);
  return;
}

Assistant:

TEST_F (MapWriter, write) {
    std::vector<std::uint8_t> expected_bytes;
    pstore::serialize::archive::vector_writer expected{expected_bytes};

    pstore::serialize::write (expected, std::size_t{2});
    pstore::serialize::write (expected, "k1"s);
    pstore::serialize::write (expected, "First key"s);
    pstore::serialize::write (expected, "k2"s);
    pstore::serialize::write (expected, "Second key"s);

    auto const num_expected_bytes = std::distance (std::begin (expected), std::end (expected));
    auto const num_actual_bytes = std::distance (std::begin (writer_), std::end (writer_));
    ASSERT_EQ (num_expected_bytes, num_actual_bytes);

    EXPECT_TRUE (std::equal (std::begin (expected), std::end (expected), std::begin (writer_)));
}